

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MidiMessage.cpp
# Opt level: O1

void __thiscall
smf::MidiMessage::makeTemperamentBad
          (MidiMessage *this,double maxDeviationCents,int referencePitchClass,int channelMask)

{
  int iVar1;
  pointer pdVar2;
  vector<double,_std::allocator<double>_> *__range1;
  long lVar3;
  value_type_conflict3 *__val;
  undefined4 uVar4;
  undefined4 uVar5;
  double dVar6;
  vector<double,_std::allocator<double>_> temperament;
  vector<double,_std::allocator<double>_> local_48;
  double local_30;
  
  dVar6 = -maxDeviationCents;
  if (-maxDeviationCents <= maxDeviationCents) {
    dVar6 = maxDeviationCents;
  }
  uVar4 = 0;
  uVar5 = 0x40590000;
  if (dVar6 <= 100.0) {
    uVar4 = SUB84(dVar6,0);
    uVar5 = (undefined4)((ulong)dVar6 >> 0x20);
  }
  local_30 = (double)CONCAT44(uVar5,uVar4);
  local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  pdVar2 = (pointer)operator_new(0x60);
  local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = pdVar2 + 0xc;
  *pdVar2 = 0.0;
  pdVar2[1] = 0.0;
  pdVar2[2] = 0.0;
  pdVar2[3] = 0.0;
  pdVar2[4] = 0.0;
  pdVar2[5] = 0.0;
  pdVar2[6] = 0.0;
  pdVar2[7] = 0.0;
  pdVar2[8] = 0.0;
  pdVar2[9] = 0.0;
  pdVar2[10] = 0.0;
  pdVar2[0xb] = 0.0;
  lVar3 = 0;
  local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = pdVar2;
  local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage =
       local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
       _M_finish;
  do {
    iVar1 = rand();
    *(double *)((long)pdVar2 + lVar3) =
         ((double)iVar1 / 2147483647.0 + (double)iVar1 / 2147483647.0 + -1.0) * local_30;
    lVar3 = lVar3 + 8;
  } while (lVar3 != 0x60);
  makeMts9_TemperamentByCentsDeviationFromET(this,&local_48,referencePitchClass,channelMask);
  operator_delete(pdVar2);
  return;
}

Assistant:

void MidiMessage::makeTemperamentBad(double maxDeviationCents, int referencePitchClass, int channelMask) {
	if (maxDeviationCents < 0.0) {
		maxDeviationCents = -maxDeviationCents;
	}
	if (maxDeviationCents > 100.0) {
		maxDeviationCents = 100.0;
	}
	std::vector<double> temperament(12);
	for (double &item : temperament) {
		item = ((rand() / (double)RAND_MAX) * 2.0 - 1.0) * maxDeviationCents;
	}
	this->makeMts9_TemperamentByCentsDeviationFromET(temperament, referencePitchClass, channelMask);
}